

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.h
# Opt level: O0

bool __thiscall
mocker::detail::ValueNumberTable::has(ValueNumberTable *this,shared_ptr<mocker::ir::Addr> *addr)

{
  bool bVar1;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *addr_local;
  ValueNumberTable *this_local;
  
  reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr;
  ir::dyc<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_30,addr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    this_local._7_1_ =
         isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>>,std::shared_ptr<mocker::ir::Reg>>
                   (&this->vn,(shared_ptr<mocker::ir::Reg> *)local_30);
  }
  else {
    this_local._7_1_ = true;
  }
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool has(const std::shared_ptr<ir::Addr> & addr) const {
    auto reg = ir::dyc<ir::Reg>(addr);
    if (!reg)
      return true;
    return isIn(vn, reg);
  }